

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_image *
rf_gen_image_gradient_v_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,rf_color top,rf_color bottom,
          rf_color *dst,rf_int dst_size)

{
  rf_color *prVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  undefined1 auVar9 [13];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [13];
  ulong uVar13;
  undefined1 auVar14 [13];
  undefined1 auVar15 [16];
  long lVar16;
  long lVar17;
  rf_color *prVar18;
  short sVar19;
  float fVar20;
  undefined1 auVar23 [16];
  float fVar24;
  char cVar3;
  char cVar4;
  char cVar5;
  undefined4 uVar21;
  undefined6 uVar22;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  auVar15 = _DAT_00177d80;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (width * height * 4 <= dst_size) {
    if (0 < height) {
      auVar9[0xc] = bottom.a;
      auVar9._0_12_ = ZEXT712(0);
      uVar13 = (ulong)top._0_2_ & 0xffffffffffff00ff;
      auVar10._8_4_ = 0;
      auVar10._0_8_ = uVar13;
      auVar10[0xc] = top.a;
      auVar11[8] = top.b;
      auVar11._0_8_ = uVar13;
      auVar11[9] = 0;
      auVar11._10_3_ = auVar10._10_3_;
      auVar14._5_8_ = 0;
      auVar14._0_5_ = auVar11._8_5_;
      auVar12[4] = top.g;
      auVar12._0_4_ = (int)uVar13;
      auVar12[5] = 0;
      auVar12._6_7_ = SUB137(auVar14 << 0x40,6);
      lVar17 = 0;
      prVar18 = dst;
      do {
        if (0 < width) {
          fVar20 = (float)lVar17 / (float)height;
          fVar24 = 1.0 - fVar20;
          auVar23._0_4_ = (int)(fVar20 * (float)((uint)bottom & 0xff) + fVar24 * (float)(int)uVar13)
          ;
          auVar23._4_4_ =
               (int)(fVar20 * (float)((uint)bottom >> 8 & 0xff) + fVar24 * (float)auVar12._4_4_);
          auVar23._8_4_ =
               (int)(fVar20 * (float)(int)CONCAT32(auVar9._10_3_,(ushort)bottom.b) +
                    fVar24 * (float)auVar11._8_4_);
          auVar23._12_4_ =
               (int)(fVar20 * (float)(uint3)(auVar9._10_3_ >> 0x10) +
                    fVar24 * (float)(uint3)(auVar10._10_3_ >> 0x10));
          auVar23 = auVar23 & auVar15;
          sVar6 = auVar23._0_2_;
          cVar2 = (0 < sVar6) * (sVar6 < 0x100) * auVar23[0] - (0xff < sVar6);
          sVar6 = auVar23._2_2_;
          sVar19 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * auVar23[2] - (0xff < sVar6),cVar2);
          sVar6 = auVar23._4_2_;
          cVar3 = (0 < sVar6) * (sVar6 < 0x100) * auVar23[4] - (0xff < sVar6);
          sVar6 = auVar23._6_2_;
          uVar21 = CONCAT13((0 < sVar6) * (sVar6 < 0x100) * auVar23[6] - (0xff < sVar6),
                            CONCAT12(cVar3,sVar19));
          sVar6 = auVar23._8_2_;
          cVar4 = (0 < sVar6) * (sVar6 < 0x100) * auVar23[8] - (0xff < sVar6);
          sVar6 = auVar23._10_2_;
          uVar22 = CONCAT15((0 < sVar6) * (sVar6 < 0x100) * auVar23[10] - (0xff < sVar6),
                            CONCAT14(cVar4,uVar21));
          sVar6 = auVar23._12_2_;
          cVar5 = (0 < sVar6) * (sVar6 < 0x100) * auVar23[0xc] - (0xff < sVar6);
          sVar8 = auVar23._14_2_;
          sVar6 = (short)((uint)uVar21 >> 0x10);
          sVar7 = (short)((uint6)uVar22 >> 0x20);
          sVar8 = (short)(CONCAT17((0 < sVar8) * (sVar8 < 0x100) * auVar23[0xe] - (0xff < sVar8),
                                   CONCAT16(cVar5,uVar22)) >> 0x30);
          lVar16 = 0;
          do {
            prVar1 = prVar18 + lVar16;
            prVar1->r = (0 < sVar19) * (sVar19 < 0x100) * cVar2 - (0xff < sVar19);
            prVar1->g = (0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6);
            prVar1->b = (0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7);
            prVar1->a = (0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8);
            lVar16 = lVar16 + 1;
          } while (width != lVar16);
        }
        lVar17 = lVar17 + 1;
        prVar18 = prVar18 + width;
      } while (lVar17 != height);
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_gradient_v_to_buffer(int width, int height, rf_color top, rf_color bottom, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        for (rf_int j = 0; j < height; j++)
        {
            float factor = ((float)j) / ((float)height);

            for (rf_int i = 0; i < width; i++)
            {
                ((rf_color*)dst)[j * width + i].r = (int)((float)bottom.r * factor + (float)top.r * (1.f - factor));
                ((rf_color*)dst)[j * width + i].g = (int)((float)bottom.g * factor + (float)top.g * (1.f - factor));
                ((rf_color*)dst)[j * width + i].b = (int)((float)bottom.b * factor + (float)top.b * (1.f - factor));
                ((rf_color*)dst)[j * width + i].a = (int)((float)bottom.a * factor + (float)top.a * (1.f - factor));
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true
        };
    }

    return result;
}